

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Human.cpp
# Opt level: O2

string * __thiscall Human::Last_Name_Getter_abi_cxx11_(string *__return_storage_ptr__,Human *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Last_Name);
  return __return_storage_ptr__;
}

Assistant:

string Human ::Last_Name_Getter(){
    return Last_Name;
}